

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.cpp
# Opt level: O1

void __thiscall
wasm::PassRegistry::registerPass(PassRegistry *this,char *name,char *description,Creator *create)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Creator *__x;
  iterator iVar2;
  mapped_type *this_00;
  PassInfo local_e0;
  string local_98;
  _Any_data local_78;
  code *local_68;
  key_type local_58;
  allocator<char> local_32;
  allocator<char> local_31;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,name,(allocator<char> *)&local_58);
  iVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wasm::PassRegistry::PassInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wasm::PassRegistry::PassInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wasm::PassRegistry::PassInfo>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wasm::PassRegistry::PassInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wasm::PassRegistry::PassInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wasm::PassRegistry::PassInfo>_>_>
                  *)this,&local_e0.description);
  if ((_Rb_tree_header *)iVar2._M_node == &(this->passInfos)._M_t._M_impl.super__Rb_tree_header) {
    paVar1 = &local_e0.description.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0.description._M_dataplus._M_p != paVar1) {
      operator_delete(local_e0.description._M_dataplus._M_p,
                      local_e0.description.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,description,&local_32);
    std::function<wasm::Pass_*()>::function((function<wasm::Pass_*()> *)&local_78,create);
    PassInfo::PassInfo(&local_e0,&local_98,(Creator *)&local_78,false);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,name,&local_31);
    this_00 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wasm::PassRegistry::PassInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wasm::PassRegistry::PassInfo>_>_>
              ::operator[](&this->passInfos,&local_58);
    std::__cxx11::string::operator=((string *)this_00,(string *)&local_e0);
    __x = &local_e0.create;
    std::function<wasm::Pass_*()>::operator=(&this_00->create,__x);
    this_00->hidden = local_e0.hidden;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    if (local_e0.create.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_e0.create.super__Function_base._M_manager)
                ((_Any_data *)__x,(_Any_data *)__x,__destroy_functor);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0.description._M_dataplus._M_p != paVar1) {
      operator_delete(local_e0.description._M_dataplus._M_p,
                      local_e0.description.field_2._M_allocated_capacity + 1);
    }
    if (local_68 != (code *)0x0) {
      (*local_68)(&local_78,&local_78,__destroy_functor);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    return;
  }
  __assert_fail("passInfos.find(name) == passInfos.end()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/pass.cpp"
                ,0x2f,"void wasm::PassRegistry::registerPass(const char *, const char *, Creator)");
}

Assistant:

void PassRegistry::registerPass(const char* name,
                                const char* description,
                                Creator create) {
  assert(passInfos.find(name) == passInfos.end());
  passInfos[name] = PassInfo(description, create);
}